

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgcmp.c
# Opt level: O3

jas_image_t * makediffimage(jas_matrix_t *origdata,jas_matrix_t *recondata)

{
  long lVar1;
  long lVar2;
  jas_seqent_t *pjVar3;
  jas_seqent_t *pjVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  jas_image_t *pjVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  jas_matrix_t *diffdata [3];
  jas_image_cmptparm_t compparms [3];
  undefined1 auStack_110 [8];
  undefined1 local_108 [8];
  undefined1 local_100 [8];
  undefined1 local_f8 [8];
  undefined1 local_f0 [8];
  undefined1 local_e8 [12];
  undefined8 uStack_dc;
  
  lVar1 = origdata->numrows_;
  lVar2 = origdata->numcols_;
  lVar7 = 0x34;
  do {
    *(undefined8 *)(auStack_110 + lVar7 + 4) = 0;
    *(undefined8 *)(local_108 + lVar7 + 4) = 0;
    *(undefined8 *)(local_100 + lVar7 + 4) = 1;
    *(undefined8 *)(local_f8 + lVar7 + 4) = 1;
    *(long *)(local_f0 + lVar7 + 4) = lVar2;
    *(long *)(local_e8 + lVar7 + 4) = lVar1;
    *(undefined8 *)((long)&uStack_dc + lVar7) = 8;
    lVar7 = lVar7 + 0x38;
  } while (lVar7 != 0xdc);
  auStack_110 = (undefined1  [8])0x102ab5;
  local_100 = (undefined1  [8])recondata;
  pjVar8 = (jas_image_t *)jas_image_create(3,(long)&uStack_dc + 4,0x401);
  if (pjVar8 == (jas_image_t *)0x0) {
    auStack_110 = (undefined1  [8])0x102bd1;
    makediffimage_cold_3();
LAB_00102be7:
    pjVar8 = (jas_image_t *)0x0;
  }
  else {
    lVar7 = 0;
    do {
      auStack_110 = (undefined1  [8])0x102ace;
      lVar9 = jas_matrix_create(lVar1);
      *(long *)(local_f8 + lVar7 * 8) = lVar9;
      if (lVar9 == 0) {
        auStack_110 = (undefined1  [8])0x102bd8;
        makediffimage_cold_2();
        goto LAB_00102bdf;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != 3);
    if (0 < lVar1) {
      lVar7 = 0;
      do {
        if (0 < lVar2) {
          pjVar3 = origdata->rows_[lVar7];
          pjVar4 = (*(jas_seqent_t ***)((long)local_100 + 0x38))[lVar7];
          lVar9 = *(long *)(*(long *)((long)local_f0 + 0x38) + lVar7 * 8);
          lVar5 = *(long *)(*(long *)(local_e8._0_8_ + 0x38) + lVar7 * 8);
          lVar11 = 0;
          do {
            lVar10 = pjVar3[lVar11];
            if (pjVar4[lVar11] < lVar10) {
              *(undefined8 *)(*(long *)(*(long *)((long)local_f8 + 0x38) + lVar7 * 8) + lVar11 * 8)
                   = 0xff;
              lVar10 = 0;
LAB_00102b61:
              lVar12 = 0;
            }
            else {
              lVar12 = *(long *)(*(long *)((long)local_f8 + 0x38) + lVar7 * 8);
              if (lVar10 < pjVar4[lVar11]) {
                *(undefined8 *)(lVar12 + lVar11 * 8) = 0;
                lVar10 = 0xff;
                goto LAB_00102b61;
              }
              *(long *)(lVar12 + lVar11 * 8) = lVar10;
              lVar12 = lVar10;
            }
            *(long *)(lVar9 + lVar11 * 8) = lVar10;
            *(long *)(lVar5 + lVar11 * 8) = lVar12;
            lVar11 = lVar11 + 1;
          } while (lVar2 != lVar11);
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 != lVar1);
    }
    uVar13 = 0;
    do {
      local_108 = *(undefined1 (*) [8])(local_f8 + uVar13 * 8);
      auStack_110 = (undefined1  [8])0x102baa;
      iVar6 = jas_image_writecmpt(pjVar8,uVar13 & 0xffffffff,0,0,lVar2,lVar1);
      if (iVar6 != 0) {
        auStack_110 = (undefined1  [8])0x102bdf;
        makediffimage_cold_1();
LAB_00102bdf:
        auStack_110 = (undefined1  [8])0x102be7;
        jas_image_destroy(pjVar8);
        goto LAB_00102be7;
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 != 3);
  }
  return pjVar8;
}

Assistant:

jas_image_t *makediffimage(jas_matrix_t *origdata, jas_matrix_t *recondata)
{
	jas_image_t *diffimage;
	jas_matrix_t *diffdata[3];
	int i;
	jas_image_cmptparm_t compparms[3];
	jas_seqent_t a;
	jas_seqent_t b;

	diffimage = 0;
	const jas_matind_t width = jas_matrix_numcols(origdata);
	const jas_matind_t height = jas_matrix_numrows(origdata);

	for (i = 0; i < 3; ++i) {
		compparms[i].tlx = 0;
		compparms[i].tly = 0;
		compparms[i].hstep = 1;
		compparms[i].vstep = 1;
		compparms[i].width = width;
		compparms[i].height = height;
		compparms[i].prec = 8;
		compparms[i].sgnd = false;
	}
	if (!(diffimage = jas_image_create(3, compparms, JAS_CLRSPC_SRGB))) {
		fprintf(stderr, "cannot create image\n");
		goto error;
	}

	for (i = 0; i < 3; ++i) {
		if (!(diffdata[i] = jas_matrix_create(height, width))) {
			fprintf(stderr, "cannot create matrix\n");
			goto error;
		}
	}

	for (jas_matind_t j = 0; j < height; ++j) {
		for (jas_matind_t k = 0; k < width; ++k) {
			a = jas_matrix_get(origdata, j, k);
			b = jas_matrix_get(recondata, j, k);
			if (a > b) {
				jas_matrix_set(diffdata[0], j, k, 255);
				jas_matrix_set(diffdata[1], j, k, 0);
				jas_matrix_set(diffdata[2], j, k, 0);
			} else if (a < b) {
				jas_matrix_set(diffdata[0], j, k, 0);
				jas_matrix_set(diffdata[1], j, k, 255);
				jas_matrix_set(diffdata[2], j, k, 0);
			} else {
				jas_matrix_set(diffdata[0], j, k, a);
				jas_matrix_set(diffdata[1], j, k, a);
				jas_matrix_set(diffdata[2], j, k, a);
			}
		}
	}

	for (i = 0; i < 3; ++i) {
		if (jas_image_writecmpt(diffimage, i, 0, 0, width, height, diffdata[i])) {
			fprintf(stderr, "cannot write image component\n");
			goto error;
		}
	}

	return diffimage;

error:
	if (diffimage) {
		jas_image_destroy(diffimage);
	}
	return 0;
}